

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

C * __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::insertSpace
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t index,
          size_t length)

{
  ulong uVar1;
  C *pCVar2;
  long in_RDX;
  ulong in_RSI;
  wchar_t *in_RDI;
  C *dst;
  size_t oldLength;
  size_t in_stack_00000030;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_stack_00000038;
  ulong local_18;
  wchar_t *local_8;
  
  uVar1 = *(ulong *)(in_RDI + 4);
  pCVar2 = createBuffer(in_stack_00000038,in_stack_00000030,this._7_1_);
  if (pCVar2 == (C *)0x0) {
    local_8 = (wchar_t *)0x0;
  }
  else {
    local_18 = in_RSI;
    if (uVar1 < in_RSI) {
      local_18 = uVar1;
    }
    local_8 = (wchar_t *)(*(long *)in_RDI + local_18 * 4);
    if ((in_RDX != 0) && (local_18 < uVar1)) {
      StringDetailsImpl<wchar_t>::move(local_8,in_RDI,0x133cd1);
    }
  }
  return local_8;
}

Assistant:

C*
	insertSpace(
		size_t index,
		size_t length
	) {
		size_t oldLength = this->m_length;

		if (!createBuffer(oldLength + length, true))
			return NULL;

		if (index > oldLength)
			index = oldLength;

		C* dst = this->m_p + index;

		if (length && index < oldLength)
			Details::move(dst + length, dst, oldLength - index);

		return dst;
	}